

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-lstm.cc
# Opt level: O0

void __thiscall
dynet::VanillaLSTMC::backward_dev_impl<dynet::Device_CPU>
          (VanillaLSTMC *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Dim *in_RCX;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDX;
  int in_R9D;
  DSizes<long,_2> sizes_1;
  DSizes<long,_2> indices_g;
  DSizes<long,_2> indices_f;
  DSizes<long,_2> indices_i;
  uint hidden_dim;
  DefaultDevice *in_stack_fffffffffffffb98;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
  *in_stack_fffffffffffffba0;
  DSizes<long,_2> *in_stack_fffffffffffffba8;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
  *in_stack_fffffffffffffbb0;
  Tensor *in_stack_fffffffffffffbc0;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
  *in_stack_fffffffffffffbc8;
  TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>
  *in_stack_fffffffffffffc38;
  TensorDevice<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::DefaultDevice>
  *in_stack_fffffffffffffc40;
  TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>
  *in_stack_fffffffffffffc58;
  TensorDevice<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::DefaultDevice>
  *in_stack_fffffffffffffc60;
  DSizes<long,_2> local_70;
  DSizes<long,_2> local_60;
  DSizes<long,_2> local_50;
  DSizes<long,_2> local_40;
  uint local_30;
  int local_2c;
  Dim *local_20;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *local_18;
  
  local_2c = in_R9D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_30 = Dim::operator[](in_RCX,0);
  Eigen::DSizes<long,_2>::DSizes<>(&local_40,0,0);
  Eigen::DSizes<long,_2>::DSizes<>(&local_50,(ulong)local_30,0);
  Eigen::DSizes<long,_2>::DSizes<>(&local_60,(ulong)(local_30 * 3),0);
  Eigen::DSizes<long,_2>::DSizes<>(&local_70,(ulong)local_30,(ulong)local_20->bd);
  if (local_2c == 0) {
    Tensor::tbvec(in_stack_fffffffffffffbc0);
    std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
              (local_18,1);
    Tensor::tbvec(in_stack_fffffffffffffbc0);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
    slice<Eigen::DSizes<long,2>,Eigen::DSizes<long,2>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (DSizes<long,_2> *)in_stack_fffffffffffffba0);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
    operator*(in_stack_fffffffffffffbc8,
              (TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
               *)in_stack_fffffffffffffbc0);
    Tensor::tbvec(in_stack_fffffffffffffbc0);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
    ::device<Eigen::DefaultDevice>(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator+=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                  *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  }
  else if (local_2c == 1) {
    Tensor::tbvec(in_stack_fffffffffffffbc0);
    std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
              (local_18,1);
    Tensor::tbvec(in_stack_fffffffffffffbc0);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
    slice<Eigen::DSizes<long,2>,Eigen::DSizes<long,2>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (DSizes<long,_2> *)in_stack_fffffffffffffba0);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
    operator*(in_stack_fffffffffffffbc8,
              (TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
               *)in_stack_fffffffffffffbc0);
    Tensor::tbvec(in_stack_fffffffffffffbc0);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
    slice<Eigen::DSizes<long,2>,Eigen::DSizes<long,2>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (DSizes<long,_2> *)in_stack_fffffffffffffba0);
    Eigen::
    TensorBase<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
    ::device<Eigen::DefaultDevice>
              ((TensorBase<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
                *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    Eigen::
    TensorDevice<Eigen::TensorSlicingOp<Eigen::DSizes<long,2>const,Eigen::DSizes<long,2>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
    ::operator+=(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    Tensor::tbvec(in_stack_fffffffffffffbc0);
    std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
              (local_18,0);
    Tensor::tbvec(in_stack_fffffffffffffbc0);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
    operator*(in_stack_fffffffffffffbc8,
              (TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)
              in_stack_fffffffffffffbc0);
    Tensor::tbvec(in_stack_fffffffffffffbc0);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
    slice<Eigen::DSizes<long,2>,Eigen::DSizes<long,2>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (DSizes<long,_2> *)in_stack_fffffffffffffba0);
    Eigen::
    TensorBase<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
    ::device<Eigen::DefaultDevice>
              ((TensorBase<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
                *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    Eigen::
    TensorDevice<Eigen::TensorSlicingOp<Eigen::DSizes<long,2>const,Eigen::DSizes<long,2>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
    ::operator+=(in_stack_fffffffffffffc40,
                 (TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
                  *)in_stack_fffffffffffffc38);
    Tensor::tbvec(in_stack_fffffffffffffbc0);
    std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
              (local_18,1);
    Tensor::tbvec(in_stack_fffffffffffffbc0);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
    slice<Eigen::DSizes<long,2>,Eigen::DSizes<long,2>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (DSizes<long,_2> *)in_stack_fffffffffffffba0);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
    operator*(in_stack_fffffffffffffbc8,
              (TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
               *)in_stack_fffffffffffffbc0);
    Tensor::tbvec(in_stack_fffffffffffffbc0);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
    slice<Eigen::DSizes<long,2>,Eigen::DSizes<long,2>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (DSizes<long,_2> *)in_stack_fffffffffffffba0);
    Eigen::
    TensorBase<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
    ::device<Eigen::DefaultDevice>
              ((TensorBase<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
                *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    Eigen::
    TensorDevice<Eigen::TensorSlicingOp<Eigen::DSizes<long,2>const,Eigen::DSizes<long,2>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
    ::operator+=(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  }
  return;
}

Assistant:

void VanillaLSTMC::backward_dev_impl(const MyDevice & dev,
                               const vector<const Tensor*>& xs,
                               const Tensor& fx,
                               const Tensor& dEdf,
                               unsigned i,
                               Tensor& dEdxi) const {
    unsigned hidden_dim = fx.d[0];

    Eigen::DSizes<ptrdiff_t, 2> indices_i(0,0);
    Eigen::DSizes<ptrdiff_t, 2> indices_f(hidden_dim,0);
    Eigen::DSizes<ptrdiff_t, 2> indices_g(hidden_dim*3,0);
    Eigen::DSizes<ptrdiff_t, 2> sizes_1(hidden_dim, static_cast<ptrdiff_t>(fx.d.bd));

    if(i==0){ // dc_tm1 = dc_t . f_t
      dEdxi.tbvec().device(*dev.edevice) += dEdf.tbvec() * xs[1]->tbvec().slice(indices_f, sizes_1);
    } else if(i==1){
      // di_t = dc_t . g_t
      dEdxi.tbvec().slice(indices_i, sizes_1).device(*dev.edevice) += dEdf.tbvec() * xs[1]->tbvec().slice(indices_g, sizes_1);
      // df_t = dc_t . c_tm1
      dEdxi.tbvec().slice(indices_f, sizes_1).device(*dev.edevice) += dEdf.tbvec() * xs[0]->tbvec();
      // dg_t = dc_t . i_t
      dEdxi.tbvec().slice(indices_g, sizes_1).device(*dev.edevice) += dEdf.tbvec() * xs[1]->tbvec().slice(indices_i, sizes_1);
    }
  }